

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sparse_square_matrix.h
# Opt level: O1

void __thiscall
sparse_square_matrix<bool>::set(sparse_square_matrix<bool> *this,uint32_t i,uint32_t j,bool *value)

{
  mapped_type mVar1;
  _Bit_type *p_Var2;
  uint uVar3;
  mapped_type *pmVar4;
  uint uVar5;
  ulong uVar6;
  ulong local_18;
  
  uVar3 = this->N;
  if (uVar3 <= i) {
    __assert_fail("i < N",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/support/sparse_square_matrix.h"
                  ,0x2f,
                  "void sparse_square_matrix<bool>::set(uint32_t, uint32_t, const Ty &) [Ty = bool]"
                 );
  }
  if (j < uVar3) {
    p_Var2 = (this->denseStorage).super__Bvector_base<std::allocator<bool>_>._M_impl.
             super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p;
    mVar1 = *value;
    if ((p_Var2 == (this->denseStorage).super__Bvector_base<std::allocator<bool>_>._M_impl.
                   super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_p) &&
       ((this->denseStorage).super__Bvector_base<std::allocator<bool>_>._M_impl.
        super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_offset == 0)) {
      local_18 = (ulong)(uVar3 * i + j);
      pmVar4 = std::__detail::
               _Map_base<unsigned_long,_std::pair<const_unsigned_long,_bool>,_std::allocator<std::pair<const_unsigned_long,_bool>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
               ::operator[]((_Map_base<unsigned_long,_std::pair<const_unsigned_long,_bool>,_std::allocator<std::pair<const_unsigned_long,_bool>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                             *)&this->sparseStorage,&local_18);
      *pmVar4 = mVar1;
    }
    else {
      uVar5 = uVar3 * i + j;
      uVar3 = uVar5 >> 6;
      uVar6 = 1L << ((byte)uVar5 & 0x3f);
      if (mVar1 == false) {
        p_Var2[uVar3] = p_Var2[uVar3] & ~uVar6;
      }
      else {
        p_Var2[uVar3] = p_Var2[uVar3] | uVar6;
      }
    }
    return;
  }
  __assert_fail("j < N",
                "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/support/sparse_square_matrix.h"
                ,0x30,
                "void sparse_square_matrix<bool>::set(uint32_t, uint32_t, const Ty &) [Ty = bool]");
}

Assistant:

void set(uint32_t i, uint32_t j, const Ty& value) {
    assert(i < N);
    assert(j < N);
    if (usingDenseStorage()) {
      denseStorage[i * N + j] = value;
    } else {
      sparseStorage[i * N + j] = value;
    }
  }